

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O1

int __thiscall Patch::copy(Patch *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  EVP_PKEY_CTX EVar1;
  uint32_t uVar2;
  long lVar3;
  Node **__args;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  iterator __position;
  Node *new_root;
  Node *local_28;
  Node *pNVar5;
  Node **__args_00;
  
  __args_00 = &local_28;
  local_28 = (Node *)0x0;
  if (*(Node **)dst == (Node *)0x0) {
LAB_00169560:
    uVar2 = *(uint32_t *)(dst + 0x38);
    EVar1 = dst[0x3c];
    this->root = local_28;
    (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->left_ancestor_stack).
    super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->left_ancestor_stack).
    super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->left_ancestor_stack).
    super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this->change_count = uVar2;
    this->merges_adjacent_changes = (bool)EVar1;
    return (int)this;
  }
  iVar4 = Node::copy(*(Node **)dst,dst,src);
  pNVar5 = (Node *)CONCAT44(extraout_var,iVar4);
  if (*(long *)(dst + 0x10) != *(long *)(dst + 8)) {
    *(long *)(dst + 0x10) = *(long *)(dst + 8);
  }
  __position._M_current = *(Node ***)(dst + 0x10);
  src_00 = extraout_RDX;
  local_28 = pNVar5;
  if ((EVP_PKEY_CTX *)__position._M_current != *(EVP_PKEY_CTX **)(dst + 0x18)) goto LAB_001694e1;
  do {
    std::vector<Patch::Node*,std::allocator<Patch::Node*>>::_M_realloc_insert<Patch::Node*const&>
              ((vector<Patch::Node*,std::allocator<Patch::Node*>> *)(dst + 8),__position,__args_00);
    src_00 = extraout_RDX_00;
    while( true ) {
      do {
        lVar3 = *(long *)(dst + 0x10);
        if (*(long *)(dst + 8) == lVar3) goto LAB_00169560;
        __args = *(Node ***)(lVar3 + -8);
        *(long *)(dst + 0x10) = lVar3 + -8;
        if (*__args != (Node *)0x0) {
          iVar4 = Node::copy(*__args,(EVP_PKEY_CTX *)__position._M_current,src_00);
          *__args = (Node *)CONCAT44(extraout_var_00,iVar4);
          __position._M_current = *(Node ***)(dst + 0x10);
          if (__position._M_current == *(Node ***)(dst + 0x18)) {
            std::vector<Patch::Node*,std::allocator<Patch::Node*>>::
            _M_realloc_insert<Patch::Node*const&>
                      ((vector<Patch::Node*,std::allocator<Patch::Node*>> *)(dst + 8),__position,
                       __args);
            src_00 = extraout_RDX_02;
          }
          else {
            *__position._M_current = (Node *)CONCAT44(extraout_var_00,iVar4);
            *(long *)(dst + 0x10) = *(long *)(dst + 0x10) + 8;
            src_00 = extraout_RDX_01;
          }
        }
      } while (__args[1] == (Node *)0x0);
      __args_00 = __args + 1;
      iVar4 = Node::copy(__args[1],(EVP_PKEY_CTX *)__position._M_current,src_00);
      pNVar5 = (Node *)CONCAT44(extraout_var_01,iVar4);
      *__args_00 = pNVar5;
      __position._M_current = *(Node ***)(dst + 0x10);
      src_00 = extraout_RDX_03;
      if ((EVP_PKEY_CTX *)__position._M_current == *(EVP_PKEY_CTX **)(dst + 0x18)) break;
LAB_001694e1:
      *__position._M_current = pNVar5;
      *(long *)(dst + 0x10) = *(long *)(dst + 0x10) + 8;
    }
  } while( true );
}

Assistant:

Patch Patch::copy() {
  Node *new_root = nullptr;
  if (root) {
    new_root = root->copy();
    node_stack.clear();
    node_stack.push_back(new_root);

    while (!node_stack.empty()) {
      Node *node = node_stack.back();
      node_stack.pop_back();
      if (node->left) {
        node->left = node->left->copy();
        node_stack.push_back(node->left);
      }
      if (node->right) {
        node->right = node->right->copy();
        node_stack.push_back(node->right);
      }
    }
  }

  return Patch{new_root, change_count, merges_adjacent_changes};
}